

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O1

void __thiscall vmdict_TrieNode::add_word(vmdict_TrieNode *this,char *str,size_t len)

{
  vmdict_TrieNode *pvVar1;
  wchar_t wVar2;
  vmdict_TrieNode *pvVar3;
  
  pvVar3 = this;
  if (len != 0) {
    do {
      wVar2 = utf8_ptr::s_getch(str);
      for (this = pvVar3->chi; this != (vmdict_TrieNode *)0x0; this = this->nxt) {
        if (this->ch == wVar2) goto LAB_0024a85b;
      }
      this = (vmdict_TrieNode *)operator_new(0x18);
      pvVar1 = pvVar3->chi;
      this->ch = wVar2;
      this->word_cnt = 0;
      this->nxt = pvVar1;
      this->chi = (vmdict_TrieNode *)0x0;
      pvVar3->chi = this;
LAB_0024a85b:
      len = (size_t)((byte *)str +
                    (len - (long)((byte *)str +
                                 (ulong)((((byte)*str >> 5 & 1) != 0) + 1 &
                                        (uint)((byte)*str >> 7) * 3) + 1)));
      str = (char *)((byte *)str +
                    (ulong)((((byte)*str >> 5 & 1) != 0) + 1 & (uint)((byte)*str >> 7) * 3) + 1);
      pvVar3 = this;
    } while ((byte *)len != (byte *)0x0);
  }
  this->word_cnt = this->word_cnt + 1;
  return;
}

Assistant:

void vmdict_TrieNode::add_word(const char *str, size_t len)
{
    vmdict_TrieNode *n;
    utf8_ptr p((char *)str);

    /* scan the string and walk the Trie */
    for (n = this ; len != 0 ; p.inc(&len))
    {
        /* get this character */
        wchar_t ch = p.getch();

        /* find the child node for this letter */
        vmdict_TrieNode *chi;
        for (chi = n->chi ; chi != 0 && chi->ch != ch ; chi = chi->nxt) ;

        /* if there's no existing child for this letter, add one */
        if (chi == 0)
            n->chi = chi = new vmdict_TrieNode(n->chi, ch);

        /* advance to this child node */
        n = chi;
    }

    /* 'n' is the final node for this word, so count the word there */
    n->word_cnt += 1;
}